

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LSTM.cpp
# Opt level: O2

void CoreMLConverter::convertCaffeLSTM(ConvertLayerParameters layerParameters)

{
  string *psVar1;
  uint uVar2;
  RepeatedPtrFieldBase *this;
  int iVar3;
  int iVar4;
  Type *pTVar5;
  Type *pTVar6;
  NeuralNetworkLayer *this_00;
  Type *pTVar7;
  mapped_type *pmVar8;
  UniDirectionalLSTMLayerParams *pUVar9;
  Type *pTVar10;
  uint64 uVar11;
  LSTMParams *pLVar12;
  ActivationParams *pAVar13;
  LSTMWeightParams *pLVar14;
  WeightParams *pWVar15;
  RepeatedPtrField<caffe::BlobProto> *this_01;
  BlobShape *this_02;
  int i_4;
  int i_3;
  RecurrentParameter *pRVar16;
  RepeatedPtrField<CoreML::Specification::ActivationParams> *this_03;
  int i;
  int iVar17;
  int iVar18;
  allocator local_209;
  float local_208 [8];
  UniDirectionalLSTMLayerParams *local_1e8;
  pointer local_1e0;
  uint64 local_1d8;
  Type *local_1d0;
  RepeatedPtrFieldBase *local_1c8;
  string local_1c0;
  ulong local_1a0;
  ulong local_198;
  string local_190;
  long local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  string local_148;
  string local_128;
  string local_108;
  string cnameout;
  string hnameout;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  top;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  bottom;
  string cnamein;
  string hnamein;
  
  iVar4 = *layerParameters.layerId;
  pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                     (&((layerParameters.prototxt)->layer_).super_RepeatedPtrFieldBase,iVar4);
  iVar3 = getLayerIndex(pTVar5,layerParameters.mapCaffeLayerNamesToIndex);
  pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                     (&((layerParameters.protoweights)->layer_).super_RepeatedPtrFieldBase,iVar3);
  this_00 = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::Add
                      (layerParameters.nnWrite);
  bottom.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  bottom.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  bottom.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1d0 = pTVar5;
  pTVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                     (&(pTVar5->bottom_).super_RepeatedPtrFieldBase,0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&bottom,pTVar7);
  std::__cxx11::to_string(&hnameout,iVar4);
  std::operator+(&cnamein,"LSTM_",&hnameout);
  std::operator+(&hnamein,&cnamein,"_h_in");
  std::__cxx11::string::~string((string *)&cnamein);
  std::__cxx11::string::~string((string *)&hnameout);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&bottom,&hnamein);
  std::__cxx11::to_string(&cnameout,iVar4);
  std::operator+(&hnameout,"LSTM_",&cnameout);
  std::operator+(&cnamein,&hnameout,"_c_in");
  std::__cxx11::string::~string((string *)&hnameout);
  std::__cxx11::string::~string((string *)&cnameout);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&bottom,&cnamein);
  top.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  top.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  top.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pTVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                     (&(local_1d0->top_).super_RepeatedPtrFieldBase,0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&top,pTVar7);
  std::__cxx11::to_string((string *)local_208,iVar4);
  std::operator+(&cnameout,"LSTM_",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208);
  std::operator+(&hnameout,&cnameout,"_h_out");
  std::__cxx11::string::~string((string *)&cnameout);
  std::__cxx11::string::~string((string *)local_208);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&top,&hnameout);
  std::__cxx11::to_string(&local_1c0,iVar4);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208,
                 "LSTM_",&local_1c0);
  std::operator+(&cnameout,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208,
                 "_c_out");
  std::__cxx11::string::~string((string *)local_208);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&top,&cnameout);
  pTVar5 = local_1d0;
  convertCaffeMetadata
            ((local_1d0->name_).ptr_,&bottom,&top,layerParameters.nnWrite,
             layerParameters.mappingDataBlobNames);
  pRVar16 = pTVar5->recurrent_param_;
  if (pRVar16 == (RecurrentParameter *)0x0) {
    pRVar16 = (RecurrentParameter *)&caffe::_RecurrentParameter_default_instance_;
  }
  local_1e0 = (pointer)(ulong)pRVar16->num_output_;
  local_1c0._M_dataplus._M_p = local_1e0;
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)local_208,1,(value_type_conflict1 *)&local_1c0,
             (allocator_type *)&local_190);
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<long,_std::allocator<long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<long,_std::allocator<long>_>_>_>_>
           ::operator[](layerParameters.mapBlobNameToDimensions,&hnamein);
  std::vector<long,_std::allocator<long>_>::_M_move_assign
            (pmVar8,(_Vector_base<long,_std::allocator<long>_> *)local_208);
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
            ((_Vector_base<long,_std::allocator<long>_> *)local_208);
  local_1c0._M_dataplus._M_p = local_1e0;
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)local_208,1,(value_type_conflict1 *)&local_1c0,
             (allocator_type *)&local_190);
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<long,_std::allocator<long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<long,_std::allocator<long>_>_>_>_>
           ::operator[](layerParameters.mapBlobNameToDimensions,&cnamein);
  std::vector<long,_std::allocator<long>_>::_M_move_assign(pmVar8);
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
            ((_Vector_base<long,_std::allocator<long>_> *)local_208);
  if ((pTVar6->blobs_).super_RepeatedPtrFieldBase.current_size_ == 0) {
    std::__cxx11::string::string
              ((string *)local_208,"Weights not found in the caffemodel file",
               (allocator *)&local_190);
    psVar1 = (local_1d0->name_).ptr_;
    std::__cxx11::string::string((string *)&local_1c0,"Recurrent",(allocator *)&local_168);
    errorInCaffeProto((string *)local_208,psVar1,&local_1c0);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::string::~string((string *)local_208);
  }
  if (local_1e0 == (pointer)0x0) {
    std::__cxx11::string::string
              ((string *)local_208,"\'num_output\' cannot be non-positive",(allocator *)&local_190);
    psVar1 = (local_1d0->name_).ptr_;
    std::__cxx11::string::string((string *)&local_1c0,"Recurrent",(allocator *)&local_168);
    errorInCaffeProto((string *)local_208,psVar1,&local_1c0);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::string::~string((string *)local_208);
  }
  pTVar5 = local_1d0;
  if (pRVar16->expose_hidden_ == true) {
    std::__cxx11::string::string((string *)local_208,"expose_hidden",(allocator *)&local_168);
    psVar1 = (pTVar5->name_).ptr_;
    std::__cxx11::string::string((string *)&local_1c0,"Recurrent",(allocator *)&local_128);
    std::__cxx11::string::string((string *)&local_190,"True",(allocator *)&local_148);
    unsupportedCaffeParrameterWithOption((string *)local_208,psVar1,&local_1c0,&local_190);
    std::__cxx11::string::~string((string *)&local_190);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::string::~string((string *)local_208);
  }
  pUVar9 = CoreML::Specification::NeuralNetworkLayer::mutable_unidirectionallstm(this_00);
  this_01 = &pTVar6->blobs_;
  pTVar10 = google::protobuf::internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                      (&this_01->super_RepeatedPtrFieldBase,0);
  this_02 = pTVar10->shape_;
  if (this_02 == (BlobShape *)0x0) {
    this_02 = (BlobShape *)&caffe::_BlobShape_default_instance_;
  }
  uVar11 = caffe::BlobShape::dim(this_02,1);
  pUVar9->outputvectorsize_ = (uint64)local_1e0;
  if (-1 < (long)uVar11) {
    pUVar9->inputvectorsize_ = uVar11;
    pLVar12 = CoreML::Specification::UniDirectionalLSTMLayerParams::mutable_params(pUVar9);
    pLVar12->sequenceoutput_ = false;
    pLVar12 = CoreML::Specification::UniDirectionalLSTMLayerParams::mutable_params(pUVar9);
    pLVar12->forgetbias_ = false;
    pLVar12 = CoreML::Specification::UniDirectionalLSTMLayerParams::mutable_params(pUVar9);
    pLVar12->hasbiasvectors_ = true;
    this_03 = &pUVar9->activations_;
    pAVar13 = google::protobuf::RepeatedPtrField<CoreML::Specification::ActivationParams>::Add
                        (this_03);
    CoreML::Specification::ActivationParams::mutable_sigmoid(pAVar13);
    pAVar13 = google::protobuf::RepeatedPtrField<CoreML::Specification::ActivationParams>::Add
                        (this_03);
    CoreML::Specification::ActivationParams::mutable_tanh(pAVar13);
    pAVar13 = google::protobuf::RepeatedPtrField<CoreML::Specification::ActivationParams>::Add
                        (this_03);
    CoreML::Specification::ActivationParams::mutable_tanh(pAVar13);
    local_1e8 = pUVar9;
    pTVar10 = google::protobuf::internal::RepeatedPtrFieldBase::
              Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                        (&this_01->super_RepeatedPtrFieldBase,0);
    iVar4 = (pTVar10->data_).current_size_;
    local_170 = (long)local_1e0 * 4;
    if (uVar11 * local_170 - (long)iVar4 != 0) {
      std::__cxx11::to_string(&local_128,uVar11 * local_170);
      std::operator+(&local_168,"Expected blob size = ",&local_128);
      std::operator+(&local_190,&local_168," but found blob of size = ");
      std::__cxx11::to_string(&local_148,iVar4);
      std::operator+(&local_1c0,&local_190,&local_148);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208,
                     &local_1c0," in caffe");
      psVar1 = (pTVar5->name_).ptr_;
      std::__cxx11::string::string((string *)&local_108,"Recurrent",&local_209);
      errorInCaffeProto((string *)local_208,psVar1,&local_108);
      std::__cxx11::string::~string((string *)&local_108);
      std::__cxx11::string::~string((string *)local_208);
      std::__cxx11::string::~string((string *)&local_1c0);
      std::__cxx11::string::~string((string *)&local_148);
      std::__cxx11::string::~string((string *)&local_190);
      std::__cxx11::string::~string((string *)&local_168);
      std::__cxx11::string::~string((string *)&local_128);
    }
    local_1d8 = uVar11;
    pLVar14 = CoreML::Specification::UniDirectionalLSTMLayerParams::mutable_weightparams(local_1e8);
    pWVar15 = CoreML::Specification::LSTMWeightParams::mutable_inputgateweightmatrix(pLVar14);
    iVar4 = iVar4 / 4;
    local_208[0] = 0.0;
    google::protobuf::RepeatedField<float>::Resize(&pWVar15->floatvalue_,iVar4,local_208);
    iVar17 = 0;
    iVar3 = iVar4;
    if (iVar4 < 1) {
      iVar3 = 0;
    }
    for (; iVar3 != iVar17; iVar17 = iVar17 + 1) {
      pTVar10 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                          (&this_01->super_RepeatedPtrFieldBase,0);
      local_208[0] = caffe::BlobProto::data(pTVar10,iVar17);
      google::protobuf::RepeatedField<float>::Set(&pWVar15->floatvalue_,iVar17,local_208);
    }
    pLVar14 = CoreML::Specification::UniDirectionalLSTMLayerParams::mutable_weightparams(local_1e8);
    pWVar15 = CoreML::Specification::LSTMWeightParams::mutable_forgetgateweightmatrix(pLVar14);
    local_208[0] = 0.0;
    local_1c8 = &this_01->super_RepeatedPtrFieldBase;
    google::protobuf::RepeatedField<float>::Resize(&pWVar15->floatvalue_,iVar4,local_208);
    iVar17 = (int)local_1e0 * (int)local_1d8;
    for (iVar18 = 0; iVar3 != iVar18; iVar18 = iVar18 + 1) {
      pTVar10 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>(local_1c8,0);
      local_208[0] = caffe::BlobProto::data(pTVar10,iVar17 + iVar18);
      google::protobuf::RepeatedField<float>::Set(&pWVar15->floatvalue_,iVar18,local_208);
    }
    pLVar14 = CoreML::Specification::UniDirectionalLSTMLayerParams::mutable_weightparams(local_1e8);
    pWVar15 = CoreML::Specification::LSTMWeightParams::mutable_outputgateweightmatrix(pLVar14);
    local_208[0] = 0.0;
    google::protobuf::RepeatedField<float>::Resize(&pWVar15->floatvalue_,iVar4,local_208);
    uVar2 = (int)local_1e0 * 2;
    local_198 = (ulong)uVar2;
    iVar17 = uVar2 * (int)local_1d8;
    for (iVar18 = 0; iVar3 != iVar18; iVar18 = iVar18 + 1) {
      pTVar10 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>(local_1c8,0);
      local_208[0] = caffe::BlobProto::data(pTVar10,iVar17 + iVar18);
      google::protobuf::RepeatedField<float>::Set(&pWVar15->floatvalue_,iVar18,local_208);
    }
    pLVar14 = CoreML::Specification::UniDirectionalLSTMLayerParams::mutable_weightparams(local_1e8);
    pWVar15 = CoreML::Specification::LSTMWeightParams::mutable_blockinputweightmatrix(pLVar14);
    local_208[0] = 0.0;
    google::protobuf::RepeatedField<float>::Resize(&pWVar15->floatvalue_,iVar4,local_208);
    uVar2 = (int)local_1e0 * 3;
    local_1a0 = (ulong)uVar2;
    iVar4 = uVar2 * (int)local_1d8;
    for (iVar17 = 0; this = local_1c8, iVar3 != iVar17; iVar17 = iVar17 + 1) {
      pTVar10 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>(local_1c8,0);
      local_208[0] = caffe::BlobProto::data(pTVar10,iVar4 + iVar17);
      google::protobuf::RepeatedField<float>::Set(&pWVar15->floatvalue_,iVar17,local_208);
    }
    pTVar10 = google::protobuf::internal::RepeatedPtrFieldBase::
              Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>(local_1c8,1);
    pUVar9 = local_1e8;
    iVar4 = (pTVar10->data_).current_size_;
    if (local_170 != iVar4) {
      std::__cxx11::to_string(&local_128,local_170);
      std::operator+(&local_168,"Expected blob size = ",&local_128);
      std::operator+(&local_190,&local_168," but found blob of size = ");
      std::__cxx11::to_string(&local_148,iVar4);
      std::operator+(&local_1c0,&local_190,&local_148);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208,
                     &local_1c0," in caffe");
      psVar1 = (local_1d0->name_).ptr_;
      std::__cxx11::string::string((string *)&local_108,"Recurrent",&local_209);
      errorInCaffeProto((string *)local_208,psVar1,&local_108);
      std::__cxx11::string::~string((string *)&local_108);
      std::__cxx11::string::~string((string *)local_208);
      std::__cxx11::string::~string((string *)&local_1c0);
      std::__cxx11::string::~string((string *)&local_148);
      std::__cxx11::string::~string((string *)&local_190);
      std::__cxx11::string::~string((string *)&local_168);
      std::__cxx11::string::~string((string *)&local_128);
    }
    pLVar14 = CoreML::Specification::UniDirectionalLSTMLayerParams::mutable_weightparams(pUVar9);
    pWVar15 = CoreML::Specification::LSTMWeightParams::mutable_inputgatebiasvector(pLVar14);
    iVar4 = iVar4 / 4;
    local_208[0] = 0.0;
    google::protobuf::RepeatedField<float>::Resize(&pWVar15->floatvalue_,iVar4,local_208);
    iVar3 = 0;
    local_1d8 = CONCAT44(local_1d8._4_4_,iVar4);
    if (iVar4 < 1) {
      iVar4 = 0;
    }
    for (; iVar4 != iVar3; iVar3 = iVar3 + 1) {
      pTVar10 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>(this,1);
      local_208[0] = caffe::BlobProto::data(pTVar10,iVar3);
      google::protobuf::RepeatedField<float>::Set(&pWVar15->floatvalue_,iVar3,local_208);
    }
    pLVar14 = CoreML::Specification::UniDirectionalLSTMLayerParams::mutable_weightparams(local_1e8);
    pWVar15 = CoreML::Specification::LSTMWeightParams::mutable_forgetgatebiasvector(pLVar14);
    local_208[0] = 0.0;
    google::protobuf::RepeatedField<float>::Resize(&pWVar15->floatvalue_,(int)local_1d8,local_208);
    for (iVar3 = 0; iVar4 != iVar3; iVar3 = iVar3 + 1) {
      pTVar10 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>(this,1);
      local_208[0] = caffe::BlobProto::data(pTVar10,(int)local_1e0 + iVar3);
      google::protobuf::RepeatedField<float>::Set(&pWVar15->floatvalue_,iVar3,local_208);
    }
    pLVar14 = CoreML::Specification::UniDirectionalLSTMLayerParams::mutable_weightparams(local_1e8);
    pWVar15 = CoreML::Specification::LSTMWeightParams::mutable_outputgatebiasvector(pLVar14);
    local_208[0] = 0.0;
    google::protobuf::RepeatedField<float>::Resize(&pWVar15->floatvalue_,(int)local_1d8,local_208);
    for (iVar3 = 0; iVar4 != iVar3; iVar3 = iVar3 + 1) {
      pTVar10 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>(this,1);
      local_208[0] = caffe::BlobProto::data(pTVar10,(int)local_198 + iVar3);
      google::protobuf::RepeatedField<float>::Set(&pWVar15->floatvalue_,iVar3,local_208);
    }
    pLVar14 = CoreML::Specification::UniDirectionalLSTMLayerParams::mutable_weightparams(local_1e8);
    pWVar15 = CoreML::Specification::LSTMWeightParams::mutable_blockinputbiasvector(pLVar14);
    local_208[0] = 0.0;
    google::protobuf::RepeatedField<float>::Resize(&pWVar15->floatvalue_,(int)local_1d8,local_208);
    for (iVar3 = 0; iVar4 != iVar3; iVar3 = iVar3 + 1) {
      pTVar10 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>(this,1);
      local_208[0] = caffe::BlobProto::data(pTVar10,(int)local_1a0 + iVar3);
      google::protobuf::RepeatedField<float>::Set(&pWVar15->floatvalue_,iVar3,local_208);
    }
    pTVar10 = google::protobuf::internal::RepeatedPtrFieldBase::
              Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>(this,2);
    pUVar9 = local_1e8;
    iVar4 = (pTVar10->data_).current_size_;
    if (local_170 * (long)local_1e0 - (long)iVar4 != 0) {
      std::__cxx11::to_string(&local_128,local_170 * (long)local_1e0);
      std::operator+(&local_168,"Expected blob size = ",&local_128);
      std::operator+(&local_190,&local_168," but found blob of size = ");
      std::__cxx11::to_string(&local_148,iVar4);
      std::operator+(&local_1c0,&local_190,&local_148);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208,
                     &local_1c0," in caffe");
      psVar1 = (local_1d0->name_).ptr_;
      std::__cxx11::string::string((string *)&local_108,"Recurrent",&local_209);
      errorInCaffeProto((string *)local_208,psVar1,&local_108);
      std::__cxx11::string::~string((string *)&local_108);
      std::__cxx11::string::~string((string *)local_208);
      std::__cxx11::string::~string((string *)&local_1c0);
      std::__cxx11::string::~string((string *)&local_148);
      std::__cxx11::string::~string((string *)&local_190);
      std::__cxx11::string::~string((string *)&local_168);
      std::__cxx11::string::~string((string *)&local_128);
    }
    pLVar14 = CoreML::Specification::UniDirectionalLSTMLayerParams::mutable_weightparams(pUVar9);
    pWVar15 = CoreML::Specification::LSTMWeightParams::mutable_inputgaterecursionmatrix(pLVar14);
    iVar4 = iVar4 / 4;
    local_208[0] = 0.0;
    google::protobuf::RepeatedField<float>::Resize(&pWVar15->floatvalue_,iVar4,local_208);
    iVar3 = 0;
    local_1a0 = CONCAT44(local_1a0._4_4_,iVar4);
    if (iVar4 < 1) {
      iVar4 = iVar3;
    }
    for (; iVar4 != iVar3; iVar3 = iVar3 + 1) {
      pTVar10 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>(this,2);
      local_208[0] = caffe::BlobProto::data(pTVar10,iVar3);
      google::protobuf::RepeatedField<float>::Set(&pWVar15->floatvalue_,iVar3,local_208);
    }
    pLVar14 = CoreML::Specification::UniDirectionalLSTMLayerParams::mutable_weightparams(local_1e8);
    pWVar15 = CoreML::Specification::LSTMWeightParams::mutable_forgetgaterecursionmatrix(pLVar14);
    local_208[0] = 0.0;
    google::protobuf::RepeatedField<float>::Resize(&pWVar15->floatvalue_,(int)local_1a0,local_208);
    iVar3 = (int)local_1e0 * (int)local_1e0;
    for (iVar17 = 0; iVar4 != iVar17; iVar17 = iVar17 + 1) {
      pTVar10 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>(local_1c8,2);
      local_208[0] = caffe::BlobProto::data(pTVar10,iVar3 + iVar17);
      google::protobuf::RepeatedField<float>::Set(&pWVar15->floatvalue_,iVar17,local_208);
    }
    pLVar14 = CoreML::Specification::UniDirectionalLSTMLayerParams::mutable_weightparams(local_1e8);
    pWVar15 = CoreML::Specification::LSTMWeightParams::mutable_outputgaterecursionmatrix(pLVar14);
    local_208[0] = 0.0;
    google::protobuf::RepeatedField<float>::Resize(&pWVar15->floatvalue_,(int)local_1a0,local_208);
    local_198 = (ulong)(uint)((int)local_198 * (int)local_1e0);
    for (iVar17 = 0; iVar4 != iVar17; iVar17 = iVar17 + 1) {
      pTVar10 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>(local_1c8,2);
      local_208[0] = caffe::BlobProto::data(pTVar10,(int)local_198 + iVar17);
      google::protobuf::RepeatedField<float>::Set(&pWVar15->floatvalue_,iVar17,local_208);
    }
    pLVar14 = CoreML::Specification::UniDirectionalLSTMLayerParams::mutable_weightparams(local_1e8);
    pWVar15 = CoreML::Specification::LSTMWeightParams::mutable_blockinputrecursionmatrix(pLVar14);
    local_208[0] = 0.0;
    google::protobuf::RepeatedField<float>::Resize(&pWVar15->floatvalue_,(int)local_1a0,local_208);
    for (iVar17 = 0; iVar4 != iVar17; iVar17 = iVar17 + 1) {
      pTVar10 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>(local_1c8,2);
      local_208[0] = caffe::BlobProto::data(pTVar10,iVar3 * 3 + iVar17);
      google::protobuf::RepeatedField<float>::Set(&pWVar15->floatvalue_,iVar17,local_208);
    }
    std::__cxx11::string::~string((string *)&cnameout);
    std::__cxx11::string::~string((string *)&hnameout);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&top);
    std::__cxx11::string::~string((string *)&cnamein);
    std::__cxx11::string::~string((string *)&hnamein);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&bottom);
    return;
  }
  __assert_fail("input_size >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/caffeconverter/Caffe/LSTM.cpp"
                ,0x4d,
                "void CoreMLConverter::convertCaffeLSTM(CoreMLConverter::ConvertLayerParameters)");
}

Assistant:

void CoreMLConverter::convertCaffeLSTM(CoreMLConverter::ConvertLayerParameters layerParameters) {
    
    int layerId = *layerParameters.layerId;
    const caffe::LayerParameter& caffeLayer = layerParameters.prototxt.layer(layerId);
    int layerIdWeights = CoreMLConverter::getLayerIndex(caffeLayer,layerParameters.mapCaffeLayerNamesToIndex);
    const caffe::LayerParameter& caffeLayerWeights = layerParameters.protoweights.layer(layerIdWeights);
    std::map<std::string, std::string>& mappingDataBlobNames = layerParameters.mappingDataBlobNames;

    //Write Layer metadata
    auto* nnWrite = layerParameters.nnWrite;
    Specification::NeuralNetworkLayer* specLayer = nnWrite->Add();
    std::vector<std::string> bottom;
    // Caffe LSTM layers take an extra input, a binary indicator to show where one input sequence
    // ends and the next begins in order to reset the hidden state for this occurrence.
    // Since we don't support this, we need to ignore this input
    bottom.push_back(caffeLayer.bottom(0));
    // Now, we need to add the addtional hidden inputs and outputs
    std::string hnamein = "LSTM_" + std::to_string(layerId) + "_h_in";
    bottom.push_back(hnamein);
    std::string cnamein = "LSTM_" + std::to_string(layerId) + "_c_in";
    bottom.push_back(cnamein);
    
    // Same deal for top names
    std::vector<std::string> top;
    top.push_back(caffeLayer.top(0));
    std::string hnameout = "LSTM_" + std::to_string(layerId) + "_h_out";
    top.push_back(hnameout);
    std::string cnameout = "LSTM_" + std::to_string(layerId) + "_c_out";
    top.push_back(cnameout);
    
    CoreMLConverter::convertCaffeMetadata(caffeLayer.name(),
                                         bottom, top,
                                         nnWrite, mappingDataBlobNames);
    
    const caffe::RecurrentParameter& caffeLayerParams = caffeLayer.recurrent_param();
    uint32_t hidden_size = caffeLayerParams.num_output();
    layerParameters.mapBlobNameToDimensions[hnamein] = std::vector<int64_t>(1, hidden_size);
    layerParameters.mapBlobNameToDimensions[cnamein] = std::vector<int64_t>(1, hidden_size);
    
    
    //***************** Some Error Checking in Caffe Proto **********
    if (caffeLayerWeights.blobs_size()==0){
        CoreMLConverter::errorInCaffeProto("Weights not found in the caffemodel file", caffeLayer.name(), "Recurrent");
    }
    if (hidden_size<=0) {
        CoreMLConverter::errorInCaffeProto("'num_output' cannot be non-positive",caffeLayer.name(),"Recurrent");
    }
    if (caffeLayerParams.expose_hidden()) {
        CoreMLConverter::unsupportedCaffeParrameterWithOption("expose_hidden",caffeLayer.name(),"Recurrent","True");
    }
    //**************************************************************

    Specification::UniDirectionalLSTMLayerParams* specLayerParams = specLayer->mutable_unidirectionallstm();

    // Caffe is stored input, bias, Hidden
    int64_t input_size = caffeLayerWeights.blobs(0).shape().dim(1);

    specLayerParams->set_outputvectorsize(static_cast<uint64_t>(hidden_size));
    assert(input_size >= 0);
    specLayerParams->set_inputvectorsize(static_cast<uint64_t>(input_size));
    
    specLayerParams->mutable_params()->set_sequenceoutput(false);
    // Caffe doesn't support forget bias, so it won't come up
    specLayerParams->mutable_params()->set_forgetbias(false);
    specLayerParams->mutable_params()->set_hasbiasvectors(true);
    
    //Add default set of non-linearities
    specLayerParams->add_activations()->mutable_sigmoid();
    specLayerParams->add_activations()->mutable_tanh();
    specLayerParams->add_activations()->mutable_tanh();
    
    //Copy weights
    //Input Weight Matrices
    int blobSize = caffeLayerWeights.blobs(0).data_size();
    int64_t expectedSize = 4*((int64_t)hidden_size)*input_size;
    if (blobSize != expectedSize) {
        CoreMLConverter::errorInCaffeProto("Expected blob size = "+std::to_string(expectedSize)+" but found blob of size = "+std::to_string(blobSize)+" in caffe"
                          , caffeLayer.name(), "Recurrent");
    }
    
    ::google::protobuf::RepeatedField<float>* Wi = specLayerParams->mutable_weightparams()->mutable_inputgateweightmatrix()->mutable_floatvalue();
    Wi->Resize(blobSize/4, 0.0);
    for (int i=0; i<blobSize/4; i++){
        Wi->Set(i,caffeLayerWeights.blobs(0).data(i));
    }
    ::google::protobuf::RepeatedField<float>* Wf = specLayerParams->mutable_weightparams()->mutable_forgetgateweightmatrix()->mutable_floatvalue();
    Wf->Resize(blobSize/4, 0.0);
    for (int i=0; i<blobSize/4; i++){
        Wf->Set(i,caffeLayerWeights.blobs(0).data(i + static_cast<int>(hidden_size*input_size)));
    }
    ::google::protobuf::RepeatedField<float>* Wo = specLayerParams->mutable_weightparams()->mutable_outputgateweightmatrix()->mutable_floatvalue();
    Wo->Resize(blobSize/4, 0.0);
    for (int i=0; i<blobSize/4; i++){
        Wo->Set(i,caffeLayerWeights.blobs(0).data(i + 2*static_cast<int>(hidden_size*input_size)));
    }
    ::google::protobuf::RepeatedField<float>* Wz = specLayerParams->mutable_weightparams()->mutable_blockinputweightmatrix()->mutable_floatvalue();
    Wz->Resize(blobSize/4, 0.0);
    for (int i=0; i<blobSize/4; i++){
        Wz->Set(i,caffeLayerWeights.blobs(0).data(i + 3*static_cast<int>(hidden_size*input_size)));
    }
    
    //biases
    blobSize = caffeLayerWeights.blobs(1).data_size();
    expectedSize = 4*((int64_t)hidden_size);
    if (blobSize != expectedSize) {
        CoreMLConverter::errorInCaffeProto("Expected blob size = "+std::to_string(expectedSize)+" but found blob of size = "+std::to_string(blobSize)+" in caffe"
                          , caffeLayer.name(), "Recurrent");
    }
    ::google::protobuf::RepeatedField<float>* bi = specLayerParams->mutable_weightparams()->mutable_inputgatebiasvector()->mutable_floatvalue();
    bi->Resize(blobSize/4, 0.0);
    for (int i=0; i<blobSize/4; i++){
        bi->Set(i,caffeLayerWeights.blobs(1).data(i));
    }
    ::google::protobuf::RepeatedField<float>* bf = specLayerParams->mutable_weightparams()->mutable_forgetgatebiasvector()->mutable_floatvalue();
    bf->Resize(blobSize/4, 0.0);
    for (int i=0; i<blobSize/4; i++){
        bf->Set(i,caffeLayerWeights.blobs(1).data(i + static_cast<int>(hidden_size)));
    }
    ::google::protobuf::RepeatedField<float>* bo = specLayerParams->mutable_weightparams()->mutable_outputgatebiasvector()->mutable_floatvalue();
    bo->Resize(blobSize/4, 0.0);
    for (int i=0; i<blobSize/4; i++){
        bo->Set(i,caffeLayerWeights.blobs(1).data(i + 2*static_cast<int>(hidden_size)));
    }
    ::google::protobuf::RepeatedField<float>* bz = specLayerParams->mutable_weightparams()->mutable_blockinputbiasvector()->mutable_floatvalue();
    bz->Resize(blobSize/4, 0.0);
    for (int i=0; i<blobSize/4; i++){
        bz->Set(i,caffeLayerWeights.blobs(1).data(i + 3*static_cast<int>(hidden_size)));
    }
    
    
    //Recursion matrices
    blobSize = caffeLayerWeights.blobs(2).data_size();
    expectedSize = 4*((int64_t)hidden_size)*((int64_t)hidden_size);
    if (blobSize != expectedSize) {
        CoreMLConverter::errorInCaffeProto("Expected blob size = "+std::to_string(expectedSize)+" but found blob of size = "+std::to_string(blobSize)+" in caffe"
                          , caffeLayer.name(), "Recurrent");
    }
    ::google::protobuf::RepeatedField<float>* Ri = specLayerParams->mutable_weightparams()->mutable_inputgaterecursionmatrix()->mutable_floatvalue();
    Ri->Resize(blobSize/4, 0.0);
    for (int i=0; i<blobSize/4; i++){
        Ri->Set(i,caffeLayerWeights.blobs(2).data(i));
    }
    ::google::protobuf::RepeatedField<float>* Rf = specLayerParams->mutable_weightparams()->mutable_forgetgaterecursionmatrix()->mutable_floatvalue();
    Rf->Resize(blobSize/4, 0.0);
    for (int i=0; i<blobSize/4; i++){
        Rf->Set(i,caffeLayerWeights.blobs(2).data(i + static_cast<int>(hidden_size*hidden_size)));
    }
    ::google::protobuf::RepeatedField<float>* Ro = specLayerParams->mutable_weightparams()->mutable_outputgaterecursionmatrix()->mutable_floatvalue();
    Ro->Resize(blobSize/4, 0.0);
    for (int i=0; i<blobSize/4; i++){
        Ro->Set(i,caffeLayerWeights.blobs(2).data(i + 2*static_cast<int>(hidden_size*hidden_size)));
    }
    ::google::protobuf::RepeatedField<float>* Rz = specLayerParams->mutable_weightparams()->mutable_blockinputrecursionmatrix()->mutable_floatvalue();
    Rz->Resize(blobSize/4, 0.0);
    for (int i=0; i<blobSize/4; i++){
        Rz->Set(i,caffeLayerWeights.blobs(2).data(i + 3*static_cast<int>(hidden_size*hidden_size)));
    }
}